

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_to_hex.h
# Opt level: O2

void __thiscall
fmt::v8::
formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>,_char,_void>
::put_newline<fmt::v8::appender>
          (formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>,_char,_void>
           *this,appender inserter,size_t pos)

{
  string_view fmt;
  format_args args;
  size_t local_28 [2];
  
  local_28[0] = CONCAT71(local_28[0]._1_7_,10);
  detail::buffer<char>::push_back
            ((buffer<char> *)
             inserter.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
             (char *)local_28);
  if (this->put_positions == true) {
    fmt.size_ = 8;
    fmt.data_ = "{:04X}: ";
    args.field_1.values_ =
         (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_28;
    args.desc_ = 4;
    local_28[0] = pos;
    vformat_to<fmt::v8::appender,_0>(inserter,fmt,args);
  }
  return;
}

Assistant:

void put_newline(It inserter, std::size_t pos)
    {
#ifdef _WIN32
        *inserter++ = '\r';
#endif
        *inserter++ = '\n';

        if (put_positions)
        {
            fmt::format_to(inserter, "{:04X}: ", pos);
        }
    }